

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

int fctstr_incl(char *str,char *check_incl)

{
  char *pcVar1;
  char *found;
  char *check_incl_local;
  char *str_local;
  
  check_incl_local = str;
  if (str == (char *)0x0) {
    check_incl_local = fctstr_incl::blank_s;
  }
  found = check_incl;
  if (check_incl == (char *)0x0) {
    found = fctstr_incl::blank_s;
  }
  if (check_incl_local == found) {
    str_local._4_4_ = 1;
  }
  else {
    pcVar1 = strstr(check_incl_local,found);
    str_local._4_4_ = (uint)(pcVar1 != (char *)0x0);
  }
  return str_local._4_4_;
}

Assistant:

static int
fctstr_incl(char const *str, char const *check_incl)
{
    static char const *blank_s = "";
    char const *found = NULL;
    if ( str == NULL )
    {
        str = blank_s;
    }
    if ( check_incl == NULL )
    {
        check_incl = blank_s;
    }
    if ( str == check_incl )
    {
        return 1;
    }
    found = strstr(str, check_incl);
    return found != NULL;
}